

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::StrCat_abi_cxx11_
                   (AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d,AlphaNum *e,AlphaNum *f)

{
  size_t sVar1;
  char *out_00;
  AlphaNum *x2;
  AlphaNum *x1;
  AlphaNum *x3;
  AlphaNum *x2_00;
  AlphaNum *x1_00;
  AlphaNum *in_RCX;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  string *in_RDI;
  AlphaNum *in_R8;
  AlphaNum *in_R9;
  AlphaNum *in_stack_00000008;
  char *out;
  char *begin;
  string *result;
  char *out_01;
  AlphaNum *x4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  reference local_50;
  undefined1 local_31;
  AlphaNum *local_30;
  AlphaNum *local_28;
  AlphaNum *local_20;
  AlphaNum *local_18;
  AlphaNum *local_10;
  
  local_31 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  sVar1 = strings::AlphaNum::size(local_10);
  out_00 = (char *)strings::AlphaNum::size(local_18);
  x2 = (AlphaNum *)(out_00 + sVar1);
  x1 = (AlphaNum *)strings::AlphaNum::size(local_20);
  x4 = (AlphaNum *)(x1->digits + (long)(x2->digits + -0x20));
  x3 = (AlphaNum *)strings::AlphaNum::size(local_28);
  out_01 = x3->digits + (long)(x4->digits + -0x20);
  sVar1 = strings::AlphaNum::size(local_30);
  x2_00 = (AlphaNum *)(out_01 + sVar1);
  x1_00 = (AlphaNum *)strings::AlphaNum::size(in_stack_00000008);
  std::__cxx11::string::resize((ulong)in_RDI);
  local_58._M_current = (char *)std::__cxx11::string::begin();
  local_50 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_58);
  Append4(out_00,x1,x2,x3,x4);
  Append2(out_01,x1_00,x2_00);
  return in_RDI;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c,
              const AlphaNum &d, const AlphaNum &e, const AlphaNum &f) {
  string result;
  result.resize(a.size() + b.size() + c.size() + d.size() + e.size() +
                f.size());
  char *const begin = &*result.begin();
  char *out = Append4(begin, a, b, c, d);
  out = Append2(out, e, f);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}